

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.cpp
# Opt level: O0

void __thiscall
HTTP::HTTP(HTTP *this,string *host,unsigned_short port,string *path,IPAddress *outgoing)

{
  _Hash_node_code_cache<true> addr;
  uint uVar1;
  int iVar2;
  Client *pCVar3;
  string local_110;
  IPAddress local_ec [3];
  Socket_BindFailed *e;
  int retry;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  undefined1 local_50 [8];
  string request;
  IPAddress *outgoing_local;
  string *path_local;
  unsigned_short port_local;
  string *host_local;
  HTTP *this_local;
  
  request.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
  super__Hash_node_code_cache<true>._M_hash_code = (size_t)outgoing;
  std::__cxx11::string::string((string *)&this->response);
  std::__cxx11::string::string((string *)local_50);
  this->status = 0;
  this->done = false;
  std::operator+((char *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"GET ");
  std::operator+(local_b0,(char *)local_d0);
  std::operator+(local_90,local_b0);
  std::operator+(local_70,(char *)local_90);
  std::__cxx11::string::operator=((string *)local_50,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  pCVar3 = (Client *)operator_new(0xa0);
  Client::Client(pCVar3);
  this->client = pCVar3;
  uVar1 = IPAddress::operator_cast_to_unsigned_int
                    ((IPAddress *)
                     request.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
                     super__Hash_node_code_cache<true>._M_hash_code);
  addr = request.super__Hash_node_value<std::pair<const_IPAddress,_double>,_true>.
         super__Hash_node_code_cache<true>;
  if (uVar1 != 0) {
    e._0_4_ = 0;
    pCVar3 = this->client;
    iVar2 = util::rand();
    Client::Bind(pCVar3,(IPAddress *)addr._M_hash_code,(uint16_t)iVar2);
  }
  Client::SetSendBuffer(this->client,0x2000);
  Client::SetRecvBuffer(this->client,0x2000);
  pCVar3 = this->client;
  std::__cxx11::string::string((string *)&local_110,(string *)host);
  local_ec[0] = IPAddress::Lookup(&local_110);
  Client::Connect(pCVar3,local_ec,port);
  std::__cxx11::string::~string((string *)&local_110);
  this->done = false;
  Client::Send(this->client,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

HTTP::HTTP(std::string host, unsigned short port, std::string path, const IPAddress & outgoing)
{
	std::string request;

	this->status = 0;
	this->done = false;

	request = "GET " + path + " HTTP/1.1\r\n"
	"Host: " + host + "\r\n"
	"User-Agent: EOSERV\r\n"
	"Accept: */*\r\n"
	"Accept-Encoding: \r\n"
	"Connection: close\r\n"
	"\r\n";

	client = new Client;

	if (static_cast<unsigned int>(outgoing) != 0)
	{
		int retry = 0;

		while (true)
		{
			try
			{
				client->Bind(outgoing, util::rand(49152, 65535));
				break;
			}
			catch (Socket_BindFailed &e)
			{
				if (++retry >= 10)
					throw;
			}
		}
	}

	client->SetSendBuffer(8192);
	client->SetRecvBuffer(8192);

	client->Connect(IPAddress::Lookup(host), port);

	this->done = false;

	client->Send(request);
}